

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIff.c
# Opt level: O1

Iff_Man_t *
Gia_ManIffPerform(Gia_Man_t *pGia,If_LibLut_t *pLib,Tim_Man_t *pTime,int nLutSize,int nDegree)

{
  int iVar1;
  Vec_Flt_t *pVVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  int *piVar5;
  Gia_Obj_t *pGVar6;
  int iVar7;
  int iVar8;
  Iff_Man_t *p;
  ulong uVar9;
  Gia_Obj_t *pGVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  float (*pafVar14) [33];
  int iObj;
  long lVar15;
  float fVar16;
  float fVar17;
  double dVar18;
  int iFanin;
  int iFanin2;
  int iFanin1;
  float local_74;
  int local_60;
  int local_5c;
  ulong local_58;
  Tim_Man_t *local_50;
  float local_48;
  int local_44;
  int local_40;
  int local_3c;
  float (*local_38) [33];
  
  local_50 = pTime;
  if ((nDegree & 0xfffffffeU) != 2) {
    __assert_fail("nDegree == 2 || nDegree == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIff.c"
                  ,0xe9,
                  "Iff_Man_t *Gia_ManIffPerform(Gia_Man_t *, If_LibLut_t *, Tim_Man_t *, int, int)")
    ;
  }
  p = Gia_ManIffStart(pGia);
  p->pGia = pGia;
  p->pLib = pLib;
  p->nLutSize = nLutSize;
  p->nDegree = nDegree;
  pVVar2 = p->vTimes;
  local_44 = nDegree;
  if (pVVar2->nSize < 1) {
LAB_006f3ead:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                  ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
  }
  *pVVar2->pArray = 0.0;
  Tim_ManIncrementTravId(local_50);
  uVar9 = (ulong)(uint)pGia->nObjs;
  if (pGia->nObjs < 2) {
    dVar18 = -1000000000.0;
    iVar8 = 0;
    iVar7 = 0;
    local_60 = 0;
  }
  else {
    pafVar14 = pLib->pLutDelays;
    local_60 = 0;
    local_74 = -1e+09;
    lVar15 = 1;
    lVar11 = 0xc;
    local_58 = 0;
    iVar8 = 0;
    local_38 = pafVar14;
    do {
      pGVar3 = pGia->pObjs;
      uVar4 = *(ulong *)(&pGVar3->field_0x0 + lVar11);
      uVar13 = (uint)uVar4;
      if ((uVar4 & 0x1fffffff) == 0x1fffffff || (int)uVar13 < 0) {
        pGVar10 = (Gia_Obj_t *)(&pGVar3->field_0x0 + lVar11);
        uVar12 = (uint)(uVar4 >> 0x20);
        if ((~uVar13 & 0x9fffffff) == 0) {
          if (-1 < (int)uVar13) {
LAB_006f3f0a:
            __assert_fail("pObj->fTerm",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b8,"int Gia_ObjCioId(Gia_Obj_t *)");
          }
          fVar16 = Tim_ManGetCiArrival(local_50,uVar12 & 0x1fffffff);
          pGVar6 = pGia->pObjs;
          if ((pGVar10 < pGVar6) || (pGVar6 + pGia->nObjs <= pGVar10)) goto LAB_006f3ecc;
          uVar13 = (int)((long)pGVar3 + (lVar11 - (long)pGVar6) >> 2) * -0x55555555;
          if (((int)uVar13 < 0) || (pVVar2->nSize <= (int)uVar13)) goto LAB_006f3ead;
          pVVar2->pArray[uVar13 & 0x7fffffff] = fVar16;
          pafVar14 = local_38;
        }
        else {
          if ((-1 < (int)uVar13) || ((int)(uVar4 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIff.c"
                          ,0x125,
                          "Iff_Man_t *Gia_ManIffPerform(Gia_Man_t *, If_LibLut_t *, Tim_Man_t *, int, int)"
                         );
          }
          if ((int)uVar9 <= lVar15) {
LAB_006f3ecc:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar9 = (ulong)-(uVar13 & 0x1fffffff) + lVar15;
          iVar7 = (int)uVar9;
          if ((iVar7 < 0) || (pVVar2->nSize <= iVar7)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          if (-1 < (int)uVar13) goto LAB_006f3f0a;
          fVar16 = pVVar2->pArray[uVar9 & 0xffffffff];
          Tim_ManSetCoArrival(local_50,uVar12 & 0x1fffffff,fVar16);
          pGVar6 = pGia->pObjs;
          if ((pGVar10 < pGVar6) || (pGVar6 + pGia->nObjs <= pGVar10)) goto LAB_006f3ecc;
          uVar13 = (int)((long)pGVar3 + (lVar11 - (long)pGVar6) >> 2) * -0x55555555;
          if (((int)uVar13 < 0) || (pVVar2->nSize <= (int)uVar13)) goto LAB_006f3ead;
          pVVar2->pArray[uVar13 & 0x7fffffff] = fVar16;
          pafVar14 = local_38;
          if (local_74 <= fVar16) {
            local_74 = fVar16;
          }
        }
      }
      else {
        if (pGia->vMapping->nSize <= lVar15) goto LAB_006f3eeb;
        if (pGia->vMapping->pArray[lVar15] != 0) {
          iObj = (int)lVar15;
          fVar16 = Gia_IffObjTimeOne(p,iObj,-1,-1);
          iVar7 = pGia->vMapping->nSize;
          if (iVar7 <= lVar15) {
LAB_006f3eeb:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar5 = pGia->vMapping->pArray;
          iVar1 = piVar5[lVar15];
          if (((long)iVar1 < 0) || (iVar7 <= iVar1)) goto LAB_006f3eeb;
          local_60 = local_60 + 1;
          fVar16 = fVar16 + pafVar14[piVar5[iVar1]][0];
          fVar17 = Gia_IffObjTimeTwo(p,iObj,&local_5c,fVar16);
          if (local_44 == 3) {
            local_48 = fVar17;
            fVar17 = Gia_IffObjTimeThree(p,iObj,&local_3c,&local_40,fVar17);
            if (pVVar2->nSize <= lVar15) goto LAB_006f3ead;
            pVVar2->pArray[lVar15] = fVar17;
            if ((fVar17 != fVar16) || (NAN(fVar17) || NAN(fVar16))) {
              if ((fVar17 == local_48) && (!NAN(fVar17) && !NAN(local_48))) goto LAB_006f3dd1;
              if (local_48 <= fVar17) {
                __assert_fail("arrTime3 < arrTime2",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIff.c"
                              ,0x112,
                              "Iff_Man_t *Gia_ManIffPerform(Gia_Man_t *, If_LibLut_t *, Tim_Man_t *, int, int)"
                             );
              }
              if (p->vMatch[2]->nSize <= lVar15) goto LAB_006f3f67;
              p->vMatch[2]->pArray[lVar15] = local_3c;
              if (p->vMatch[3]->nSize <= lVar15) goto LAB_006f3f67;
              p->vMatch[3]->pArray[lVar15] = local_40;
              local_58 = (ulong)((int)local_58 + 1);
            }
          }
          else {
            if (local_44 != 2) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIff.c"
                            ,0x117,
                            "Iff_Man_t *Gia_ManIffPerform(Gia_Man_t *, If_LibLut_t *, Tim_Man_t *, int, int)"
                           );
            }
            if (pVVar2->nSize <= lVar15) goto LAB_006f3ead;
            pVVar2->pArray[lVar15] = fVar17;
            if (fVar17 < fVar16) {
LAB_006f3dd1:
              if (p->vMatch[2]->nSize <= lVar15) {
LAB_006f3f67:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                              ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              p->vMatch[2]->pArray[lVar15] = local_5c;
              iVar8 = iVar8 + 1;
            }
          }
        }
      }
      lVar15 = lVar15 + 1;
      uVar9 = (ulong)pGia->nObjs;
      lVar11 = lVar11 + 0xc;
    } while (lVar15 < (long)uVar9);
    dVar18 = (double)local_74;
    iVar7 = (int)local_58;
  }
  printf("Max delay = %.2f.  Count1 = %d.  Count2 = %d.  Count3 = %d.\n",dVar18,
         (ulong)(uint)((local_60 - iVar7) - iVar8));
  return p;
}

Assistant:

Iff_Man_t * Gia_ManIffPerform( Gia_Man_t * pGia, If_LibLut_t * pLib, Tim_Man_t * pTime, int nLutSize, int nDegree )
{
    Iff_Man_t * p;
    Gia_Obj_t * pObj;
    int iObj, iFanin, iFanin1, iFanin2;
    int CountAll = 0, Count2 = 0, Count3 = 0;
    float arrTime1, arrTime2, arrTime3, arrMax = -ABC_INFINITY; 
    assert( nDegree == 2 || nDegree == 3 );
    // start the mapping manager and set its parameters
    p = Gia_ManIffStart( pGia );
    p->pGia     = pGia;
    p->pLib     = pLib;
    p->nLutSize = nLutSize;
    p->nDegree  = nDegree;
    // compute arrival times of each node
    Iff_ObjSetTimeId( p, 0, 0 );
    Tim_ManIncrementTravId( pTime );
    Gia_ManForEachObj1( pGia, pObj, iObj )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( !Gia_ObjIsLut(pGia, iObj) )
                continue;
            CountAll++;
            // compute arrival times of LUT inputs
            arrTime1 = Gia_IffObjTimeOne( p, iObj, -1, -1 );
            arrTime1 += p->pLib->pLutDelays[Gia_ObjLutSize(pGia, iObj)][0];
            // compute arrival times of LUT pairs
            arrTime2 = Gia_IffObjTimeTwo( p, iObj, &iFanin, arrTime1 );
            if ( nDegree == 2 )
            {
                // set arrival times
                Iff_ObjSetTimeId( p, iObj, arrTime2 );
                if ( arrTime2 < arrTime1 )
                    Iff_ObjSetMatchId( p, iObj, 2, iFanin ), Count2++;                
            }
            else if ( nDegree == 3 )
            {                
                // compute arrival times of LUT triples
                arrTime3 = Gia_IffObjTimeThree( p, iObj, &iFanin1, &iFanin2, arrTime2 );
                // set arrival times
                Iff_ObjSetTimeId( p, iObj, arrTime3 );
                if ( arrTime3 == arrTime1 )
                    continue;
                if ( arrTime3 == arrTime2 )
                    Iff_ObjSetMatchId( p, iObj, 2, iFanin ), Count2++;
                else
                {
                    assert( arrTime3 < arrTime2 );
                    Iff_ObjSetMatchId( p, iObj, 2, iFanin1 );
                    Iff_ObjSetMatchId( p, iObj, 3, iFanin2 ), Count3++;
                }
            }
            else assert( 0 );
        }
        else if ( Gia_ObjIsCi(pObj) )
        {
            arrTime1 = Tim_ManGetCiArrival( pTime, Gia_ObjCioId(pObj) );
            Iff_ObjSetTime( p, pObj, arrTime1 );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            arrTime1 = Iff_ObjTimeId( p, Gia_ObjFaninId0p(pGia, pObj) );
            Tim_ManSetCoArrival( pTime, Gia_ObjCioId(pObj), arrTime1 );
            Iff_ObjSetTime( p, pObj, arrTime1 );
            arrMax = Abc_MaxFloat( arrMax, arrTime1 );
        }
        else assert( 0 );
    }
    printf( "Max delay = %.2f.  Count1 = %d.  Count2 = %d.  Count3 = %d.\n", 
        arrMax, CountAll - Count2 - Count3, Count2, Count3 );
    return p;
}